

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O3

int_t sLUMemInit(fact_t fact,void *work,int_t lwork,int m,int n,int_t annz,int panel_size,
                float fill_ratio,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,int **iwork,
                float **dwork)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ExpHeader *pEVar6;
  void *pvVar7;
  void *pvVar8;
  int_t *addr;
  int_t *addr_00;
  int iVar9;
  int_t iVar10;
  undefined4 in_register_0000000c;
  int *piVar11;
  uint uVar12;
  int n_00;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int_t nzlumax;
  int_t nzumax;
  int_t nzlmax;
  int local_188;
  int local_184;
  int_t *local_180;
  ulong local_178;
  LU_space_t *local_170;
  int_t local_164;
  int_t *local_160;
  int_t *local_158;
  int *local_150;
  undefined8 local_148;
  int *local_140;
  int local_138 [66];
  
  local_148 = CONCAT44(in_register_0000000c,m);
  local_170 = (LU_space_t *)CONCAT44(local_170._4_4_,fill_ratio);
  uVar13 = (ulong)(uint)n;
  Glu->n = n;
  Glu->num_expansions = 0;
  local_164 = annz;
  pEVar6 = (ExpHeader *)superlu_malloc(0x60);
  Glu->expanders = pEVar6;
  if (pEVar6 == (ExpHeader *)0x0) {
    sprintf((char *)local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for expanders",0xd4
            ,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/smemory.c");
    superlu_abort_and_exit((char *)local_138);
  }
  local_178 = uVar13;
  if (fact == SamePattern_SameRowPerm) {
    pvVar7 = L->Store;
    pvVar8 = U->Store;
    piVar11 = *(int **)((long)pvVar7 + 0x30);
    local_150 = *(int **)((long)pvVar7 + 0x28);
    local_160 = *(int_t **)((long)pvVar7 + 0x10);
    local_158 = *(int_t **)((long)pvVar7 + 0x20);
    local_180 = *(int_t **)((long)pvVar8 + 0x18);
    local_138[0] = Glu->nzlmax;
    local_184 = Glu->nzumax;
    local_188 = Glu->nzlumax;
    if (lwork == 0) {
      Glu->MemModel = SYSTEM;
    }
    else {
      if (lwork == -1) {
        return n * 0x15 +
               (local_138[0] + (panel_size * 3 + 8) * (int)local_148 + local_184 * 2 + local_188) *
               4 + 0x14;
      }
      uVar12 = lwork + 3;
      if (-1 < lwork) {
        uVar12 = lwork;
      }
      Glu->MemModel = USER;
      (Glu->stack).top2 = uVar12 & 0xfffffffc;
      (Glu->stack).size = uVar12 & 0xfffffffc;
    }
    addr = *(int_t **)((long)pvVar7 + 0x18);
    pEVar6 = Glu->expanders;
    pEVar6[2].mem = addr;
    pvVar7 = *(void **)((long)pvVar7 + 8);
    pEVar6->mem = pvVar7;
    addr_00 = *(int_t **)((long)pvVar8 + 0x10);
    pEVar6[3].mem = addr_00;
    pvVar8 = *(void **)((long)pvVar8 + 8);
    pEVar6[1].mem = pvVar8;
    pEVar6[2].size = local_138[0];
    pEVar6->size = local_188;
    pEVar6[3].size = local_184;
    pEVar6[1].size = local_184;
    goto LAB_00109f35;
  }
  local_188 = (int)((float)local_164 * local_170._0_4_);
  local_184 = local_188;
  local_138[0] = local_188;
  if (lwork == 0) {
    Glu->MemModel = SYSTEM;
LAB_00109b80:
    local_170 = &Glu->MemModel;
    iVar4 = n + 1;
    piVar11 = int32Malloc(iVar4);
    local_150 = int32Malloc(iVar4);
    local_158 = intMalloc(iVar4);
    local_160 = intMalloc(iVar4);
    local_180 = intMalloc(iVar4);
  }
  else {
    if (lwork == -1) {
      return n * 0x15 + (int)local_148 * (panel_size * 3 + 8) * 4 + local_188 * 0x10 + 0x14;
    }
    local_170 = &Glu->MemModel;
    if (lwork < 1) {
      if (Glu->MemModel == SYSTEM) goto LAB_00109b80;
    }
    else {
      Glu->MemModel = USER;
      (Glu->stack).used = 0;
      (Glu->stack).top1 = 0;
      (Glu->stack).top2 = lwork & 0x7ffffffcU;
      (Glu->stack).size = lwork & 0x7ffffffcU;
      (Glu->stack).array = work;
    }
    iVar9 = n * 4 + 4;
    iVar3 = (Glu->stack).used + iVar9;
    iVar4 = (Glu->stack).size;
    if (iVar3 < iVar4) {
      iVar5 = (Glu->stack).top1;
      piVar11 = (int *)((long)iVar5 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar5 + iVar9;
      (Glu->stack).used = iVar3;
      iVar3 = iVar3 + iVar9;
    }
    else {
      piVar11 = (int *)0x0;
    }
    if (iVar3 < iVar4) {
      iVar5 = (Glu->stack).top1;
      local_150 = (int *)((long)iVar5 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar5 + iVar9;
      (Glu->stack).used = iVar3;
      iVar3 = iVar3 + iVar9;
    }
    else {
      local_150 = (int *)0x0;
    }
    if (iVar3 < iVar4) {
      iVar5 = (Glu->stack).top1;
      local_158 = (int_t *)((long)iVar5 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar5 + iVar9;
      (Glu->stack).used = iVar3;
      iVar3 = iVar3 + iVar9;
    }
    else {
      local_158 = (int_t *)0x0;
    }
    if (iVar3 < iVar4) {
      iVar5 = (Glu->stack).top1;
      local_160 = (int_t *)((long)iVar5 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar5 + iVar9;
      (Glu->stack).used = iVar3;
      iVar3 = iVar3 + iVar9;
    }
    else {
      local_160 = (int_t *)0x0;
    }
    if (iVar3 < iVar4) {
      iVar4 = (Glu->stack).top1;
      local_180 = (int_t *)((long)iVar4 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar9 + iVar4;
      (Glu->stack).used = iVar3;
    }
    else {
      local_180 = (int_t *)0x0;
    }
  }
  pvVar7 = sexpand(&local_188,LUSUP,0,0,Glu);
  pvVar8 = sexpand(&local_184,UCOL,0,0,Glu);
  addr = (int_t *)sexpand(local_138,LSUB,0,0,Glu);
  addr_00 = (int_t *)sexpand(&local_184,USUB,0,1,Glu);
  auVar14._0_4_ = -(uint)((int)((ulong)pvVar7 >> 0x20) == 0 && (int)pvVar7 == 0);
  auVar14._4_4_ = -(uint)((int)pvVar8 == 0 && (int)((ulong)pvVar8 >> 0x20) == 0);
  auVar14._8_4_ = -(uint)((int)((ulong)addr >> 0x20) == 0 && (int)addr == 0);
  auVar14._12_4_ = -(uint)((int)addr_00 == 0 && (int)((ulong)addr_00 >> 0x20) == 0);
  iVar4 = movmskps((int)addr_00,auVar14);
  if (iVar4 != 0) {
    local_140 = piVar11;
    do {
      if (*local_170 == SYSTEM) {
        superlu_free(pvVar7);
        superlu_free(pvVar8);
        superlu_free(addr);
        superlu_free(addr_00);
      }
      else {
        iVar4 = (local_138[0] + local_188) * 4 + local_184 * 8;
        uVar1 = (Glu->stack).used;
        uVar2 = (Glu->stack).top1;
        (Glu->stack).used = uVar1 - iVar4;
        (Glu->stack).top1 = uVar2 - iVar4;
      }
      iVar4 = local_188 / 2;
      iVar9 = local_184 / 2;
      iVar3 = local_138[0] / 2;
      local_188 = iVar4;
      local_184 = iVar9;
      local_138[0] = iVar3;
      if (iVar4 < local_164) {
        puts("Not enough memory to perform factorization.");
        return (int)local_178 * 0x29 + iVar9 * 8 + (iVar3 + iVar4) * 4;
      }
      pvVar7 = sexpand(&local_188,LUSUP,0,0,Glu);
      pvVar8 = sexpand(&local_184,UCOL,0,0,Glu);
      addr = (int_t *)sexpand(local_138,LSUB,0,0,Glu);
      addr_00 = (int_t *)sexpand(&local_184,USUB,0,1,Glu);
      auVar15._0_4_ = -(uint)((int)((ulong)pvVar7 >> 0x20) == 0 && (int)pvVar7 == 0);
      auVar15._4_4_ = -(uint)((int)pvVar8 == 0 && (int)((ulong)pvVar8 >> 0x20) == 0);
      auVar15._8_4_ = -(uint)((int)((ulong)addr >> 0x20) == 0 && (int)addr == 0);
      auVar15._12_4_ = -(uint)((int)addr_00 == 0 && (int)((ulong)addr_00 >> 0x20) == 0);
      iVar4 = movmskps((int)addr_00,auVar15);
      piVar11 = local_140;
    } while (iVar4 != 0);
  }
LAB_00109f35:
  iVar9 = local_138[0];
  iVar3 = local_184;
  iVar4 = local_188;
  Glu->xsup = piVar11;
  Glu->supno = local_150;
  Glu->lsub = addr;
  Glu->xlsub = local_158;
  Glu->lusup = pvVar7;
  Glu->xlusup = local_160;
  Glu->ucol = pvVar8;
  Glu->usub = addr_00;
  Glu->xusub = local_180;
  Glu->nzlmax = local_138[0];
  Glu->nzumax = local_184;
  Glu->nzlumax = local_188;
  n_00 = (int)local_178;
  iVar5 = sLUWorkInit((int)local_148,n_00,panel_size,iwork,dwork,Glu);
  if (iVar5 == 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
    iVar10 = 0;
  }
  else {
    iVar10 = n_00 * 0x29 + iVar3 * 8 + (iVar4 + iVar9) * 4 + iVar5;
  }
  return iVar10;
}

Assistant:

int_t
sLUMemInit(fact_t fact, void *work, int_t lwork, int m, int n, int_t annz,
	  int panel_size, float fill_ratio, SuperMatrix *L, SuperMatrix *U,
          GlobalLU_t *Glu, int **iwork, float **dwork)
{
    int      info, iword, dword;
    SCformat *Lstore;
    NCformat *Ustore;
    int      *xsup, *supno;
    int_t    *lsub, *xlsub;
    float   *lusup;
    int_t    *xlusup;
    float   *ucol;
    int_t    *usub, *xusub;
    int_t    nzlmax, nzumax, nzlumax;
    
    iword     = sizeof(int);
    dword     = sizeof(float);
    Glu->n    = n;
    Glu->num_expansions = 0;

    Glu->expanders = (ExpHeader *) SUPERLU_MALLOC( NO_MEMTYPE *
                                                     sizeof(ExpHeader) );
    if ( !Glu->expanders ) ABORT("SUPERLU_MALLOC fails for expanders");
    
    if ( fact != SamePattern_SameRowPerm ) {
	/* Guess for L\U factors */
	nzumax = nzlumax = nzlmax = fill_ratio * annz;
	//nzlmax = SUPERLU_MAX(1, fill_ratio/4.) * annz;

	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else {
	    sSetupSpace(work, lwork, Glu);
	}
	
#if ( PRNTlevel >= 1 )
	printf("sLUMemInit() called: fill_ratio %.0f, nzlmax %lld, nzumax %lld\n", 
	       fill_ratio, (long long) nzlmax, (long long) nzumax);
	fflush(stdout);
#endif	
	
	/* Integer pointers for L\U factors */
	if ( Glu->MemModel == SYSTEM ) {
	    xsup   = int32Malloc(n+1);
	    supno  = int32Malloc(n+1);
	    xlsub  = intMalloc(n+1);
	    xlusup = intMalloc(n+1);
	    xusub  = intMalloc(n+1);
	} else {
	    xsup   = (int *)suser_malloc((n+1) * iword, HEAD, Glu);
	    supno  = (int *)suser_malloc((n+1) * iword, HEAD, Glu);
	    xlsub  = suser_malloc((n+1) * iword, HEAD, Glu);
	    xlusup = suser_malloc((n+1) * iword, HEAD, Glu);
	    xusub  = suser_malloc((n+1) * iword, HEAD, Glu);
	}

	lusup = (float *) sexpand( &nzlumax, LUSUP, 0, 0, Glu );
	ucol  = (float *) sexpand( &nzumax, UCOL, 0, 0, Glu );
	lsub  = (int_t *) sexpand( &nzlmax, LSUB, 0, 0, Glu );
	usub  = (int_t *) sexpand( &nzumax, USUB, 0, 1, Glu );

	while ( !lusup || !ucol || !lsub || !usub ) {
	    if ( Glu->MemModel == SYSTEM ) {
		SUPERLU_FREE(lusup); 
		SUPERLU_FREE(ucol); 
		SUPERLU_FREE(lsub); 
		SUPERLU_FREE(usub);
	    } else {
		suser_free((nzlumax+nzumax)*dword+(nzlmax+nzumax)*iword,
                            HEAD, Glu);
	    }
	    nzlumax /= 2;
	    nzumax /= 2;
	    nzlmax /= 2;
	    if ( nzlumax < annz ) {
		printf("Not enough memory to perform factorization.\n");
		return (smemory_usage(nzlmax, nzumax, nzlumax, n) + n);
	    }
#if ( PRNTlevel >= 1)
	    printf("sLUMemInit() reduce size: nzlmax %ld, nzumax %ld\n", 
		   (long) nzlmax, (long) nzumax);
	    fflush(stdout);
#endif
	    lusup = (float *) sexpand( &nzlumax, LUSUP, 0, 0, Glu );
	    ucol  = (float *) sexpand( &nzumax, UCOL, 0, 0, Glu );
	    lsub  = (int_t *) sexpand( &nzlmax, LSUB, 0, 0, Glu );
	    usub  = (int_t *) sexpand( &nzumax, USUB, 0, 1, Glu );
	}
	
    } else {
	/* fact == SamePattern_SameRowPerm */
	Lstore   = L->Store;
	Ustore   = U->Store;
	xsup     = Lstore->sup_to_col;
	supno    = Lstore->col_to_sup;
	xlsub    = Lstore->rowind_colptr;
	xlusup   = Lstore->nzval_colptr;
	xusub    = Ustore->colptr;
	nzlmax   = Glu->nzlmax;    /* max from previous factorization */
	nzumax   = Glu->nzumax;
	nzlumax  = Glu->nzlumax;
	
	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else if ( lwork == 0 ) {
	    Glu->MemModel = SYSTEM;
	} else {
	    Glu->MemModel = USER;
	    Glu->stack.top2 = (lwork/4)*4; /* must be word-addressable */
	    Glu->stack.size = Glu->stack.top2;
	}
	
	lsub  = Glu->expanders[LSUB].mem  = Lstore->rowind;
	lusup = Glu->expanders[LUSUP].mem = Lstore->nzval;
	usub  = Glu->expanders[USUB].mem  = Ustore->rowind;
	ucol  = Glu->expanders[UCOL].mem  = Ustore->nzval;;
	Glu->expanders[LSUB].size         = nzlmax;
	Glu->expanders[LUSUP].size        = nzlumax;
	Glu->expanders[USUB].size         = nzumax;
	Glu->expanders[UCOL].size         = nzumax;	
    }

    Glu->xsup    = xsup;
    Glu->supno   = supno;
    Glu->lsub    = lsub;
    Glu->xlsub   = xlsub;
    Glu->lusup   = (void *) lusup;
    Glu->xlusup  = xlusup;
    Glu->ucol    = (void *) ucol;
    Glu->usub    = usub;
    Glu->xusub   = xusub;
    Glu->nzlmax  = nzlmax;
    Glu->nzumax  = nzumax;
    Glu->nzlumax = nzlumax;
    
    info = sLUWorkInit(m, n, panel_size, iwork, dwork, Glu);
    if ( info )
	return ( info + smemory_usage(nzlmax, nzumax, nzlumax, n) + n);
    
    ++Glu->num_expansions;
    return 0;
    
}